

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O3

void duckdb::ValidityUncompressed::UnalignedScan
               (data_ptr_t input,idx_t input_size,idx_t input_start,Vector *result,
               idx_t result_offset,idx_t scan_count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TemplatedValidityData<unsigned_long> *pTVar3;
  _Head_base<0UL,_unsigned_long_*,_false> _Var4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t current_result_idx;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  buffer_ptr<ValidityBuffer> *local_60;
  data_ptr_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  idx_t local_38;
  
  FlatVector::VerifyFlatVector(result);
  if (scan_count != 0) {
    uVar10 = (ulong)((uint)input_start & 0x3f);
    local_40 = input_start >> 6;
    uVar9 = (ulong)((uint)result_offset & 0x3f);
    _Var4._M_head_impl = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    local_60 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar7 = 0;
    uVar8 = result_offset >> 6;
    local_58 = input;
    local_50 = scan_count;
    do {
      uVar6 = *(ulong *)(input + local_40 * 8);
      lVar5 = uVar9 - uVar10;
      if (uVar9 < uVar10) {
        lVar5 = 0x40 - uVar10;
        uVar6 = uVar6 >> ((byte)(uVar10 - uVar9) & 0x3f) | (&UPPER_MASKS)[uVar10 - uVar9];
        local_40 = local_40 + 1;
        uVar9 = uVar9 + lVar5;
        uVar10 = 0;
        local_48 = uVar8;
      }
      else {
        if (uVar9 < uVar10 || lVar5 == 0) {
          lVar5 = 0x40 - uVar9;
          local_40 = local_40 + 1;
          uVar10 = 0;
        }
        else {
          uVar6 = (uVar6 & ~(&UPPER_MASKS)[lVar5]) << ((byte)lVar5 & 0x3f) | (&LOWER_MASKS)[lVar5];
          lVar5 = 0x40 - uVar9;
          uVar10 = uVar10 + lVar5;
        }
        local_48 = uVar8 + 1;
        uVar9 = 0;
      }
      uVar7 = uVar7 + lVar5;
      if (scan_count <= uVar7 && uVar7 - scan_count != 0) {
        uVar6 = uVar6 | (&UPPER_MASKS)[uVar7 - scan_count];
      }
      if (uVar6 != 0xffffffffffffffff) {
        if (_Var4._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_38);
          p_Var2 = p_Stack_70;
          peVar1 = local_78;
          local_78 = (element_type *)0x0;
          p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar1;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var2;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
            }
          }
          pTVar3 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_60);
          _Var4._M_head_impl =
               (pTVar3->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var4._M_head_impl;
          scan_count = local_50;
          input = local_58;
        }
        _Var4._M_head_impl[uVar8] = _Var4._M_head_impl[uVar8] & uVar6;
      }
      uVar8 = local_48;
    } while (uVar7 < scan_count);
  }
  return;
}

Assistant:

void ValidityUncompressed::UnalignedScan(data_ptr_t input, idx_t input_size, idx_t input_start, Vector &result,
                                         idx_t result_offset, idx_t scan_count) {
	D_ASSERT(input_start < input_size);
	auto &result_mask = FlatVector::Validity(result);
	auto input_data = reinterpret_cast<validity_t *>(input);

#ifdef DEBUG
	// this method relies on all the bits we are going to write to being set to valid
	for (idx_t i = 0; i < scan_count; i++) {
		D_ASSERT(result_mask.RowIsValid(result_offset + i));
	}
#endif
#if STANDARD_VECTOR_SIZE < 128
	// fallback for tiny vector sizes
	// the bitwise ops we use below don't work if the vector size is too small
	ValidityMask source_mask(input_data, input_size);
	for (idx_t i = 0; i < scan_count; i++) {
		if (!source_mask.RowIsValid(input_start + i)) {
			if (result_mask.AllValid()) {
				result_mask.Initialize();
			}
			result_mask.SetInvalid(result_offset + i);
		}
	}
#else
	// the code below does what the fallback code above states, but using bitwise ops:
	auto result_data = (validity_t *)result_mask.GetData();

	// set up the initial positions
	// we need to find the validity_entry to modify, together with the bit-index WITHIN the validity entry
	idx_t result_entry = result_offset / ValidityMask::BITS_PER_VALUE;
	idx_t result_idx = result_offset - result_entry * ValidityMask::BITS_PER_VALUE;

	// same for the input: find the validity_entry we are pulling from, together with the bit-index WITHIN that entry
	idx_t input_entry = input_start / ValidityMask::BITS_PER_VALUE;
	idx_t input_idx = input_start - input_entry * ValidityMask::BITS_PER_VALUE;

	// now start the bit games
	idx_t pos = 0;
	while (pos < scan_count) {
		// these are the current validity entries we are dealing with
		idx_t current_result_idx = result_entry;
		idx_t offset;
		validity_t input_mask = input_data[input_entry];

		// construct the mask to AND together with the result
		if (result_idx < input_idx) {
			//         +======================================+
			// input:  |xxxxxxxxx|                            |
			//         +======================================+
			//
			//         +======================================+
			// result: |                xxxxxxxxx|            |
			//         +======================================+
			// 1. We shift (>>) 'input' to line up with 'result'
			// 2. We set the bits we shifted to 1

			// we have to shift the input RIGHT if the result_idx is smaller than the input_idx
			auto shift_amount = input_idx - result_idx;
			D_ASSERT(shift_amount > 0 && shift_amount <= ValidityMask::BITS_PER_VALUE);

			input_mask = input_mask >> shift_amount;

			// now the upper "shift_amount" bits are set to 0
			// we need them to be set to 1
			// otherwise the subsequent bitwise & will modify values outside of the range of values we want to alter
			input_mask |= ValidityUncompressed::UPPER_MASKS[shift_amount];

			// after this, we move to the next input_entry
			offset = ValidityMask::BITS_PER_VALUE - input_idx;
			input_entry++;
			input_idx = 0;
			result_idx += offset;
		} else if (result_idx > input_idx) {
			//         +======================================+
			// input:  |                xxxxxxxxx|            |
			//         +======================================+
			//
			//         +======================================+
			// result: |xxxxxxxxx|                            |
			//         +======================================+
			// 1. We set the bits to the left of the relevant bits (x) to 0
			// 1. We shift (<<) 'input' to line up with 'result'
			// 2. We set the bits that we zeroed to the right of the relevant bits (x) to 1

			// we have to shift the input LEFT if the result_idx is bigger than the input_idx
			auto shift_amount = result_idx - input_idx;
			D_ASSERT(shift_amount > 0 && shift_amount <= ValidityMask::BITS_PER_VALUE);

			// to avoid overflows, we set the upper "shift_amount" values to 0 first
			input_mask = (input_mask & ~ValidityUncompressed::UPPER_MASKS[shift_amount]) << shift_amount;

			// now the lower "shift_amount" bits are set to 0
			// we need them to be set to 1
			// otherwise the subsequent bitwise & will modify values outside of the range of values we want to alter
			input_mask |= ValidityUncompressed::LOWER_MASKS[shift_amount];

			// after this, we move to the next result_entry
			offset = ValidityMask::BITS_PER_VALUE - result_idx;
			result_entry++;
			result_idx = 0;
			input_idx += offset;
		} else {
			// if the input_idx is equal to result_idx they are already aligned
			// we just move to the next entry for both after this
			offset = ValidityMask::BITS_PER_VALUE - result_idx;
			input_entry++;
			result_entry++;
			result_idx = input_idx = 0;
		}
		// now we need to check if we should include the ENTIRE mask
		// OR if we need to mask from the right side
		pos += offset;
		if (pos > scan_count) {
			//        +======================================+
			// mask:  |            |xxxxxxxxxxxxxxxxxxxxxxxxx|
			//        +======================================+
			//
			// The bits on the right side of the relevant bits (x) need to stay 1, to be adjusted by later scans
			// so we adjust the mask to clear out any 0s that might be present on the right side.

			// we need to set any bits that are past the scan_count on the right-side to 1
			// this is required so we don't influence any bits that are not part of the scan
			input_mask |= ValidityUncompressed::UPPER_MASKS[pos - scan_count];
		}
		// now finally we can merge the input mask with the result mask
		if (input_mask != ValidityMask::ValidityBuffer::MAX_ENTRY) {
			if (!result_data) {
				result_mask.Initialize();
				result_data = (validity_t *)result_mask.GetData();
			}
			result_data[current_result_idx] &= input_mask;
		}
	}
#endif

#ifdef DEBUG
	// verify that we actually accomplished the bitwise ops equivalent that we wanted to do
	ValidityMask input_mask(input_data, input_size);
	for (idx_t i = 0; i < scan_count; i++) {
		D_ASSERT(result_mask.RowIsValid(result_offset + i) == input_mask.RowIsValid(input_start + i));
	}
#endif
}